

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall dxil_spv::Converter::Impl::emit_execution_modes_post_code_generation(Impl *this)

{
  bool bVar1;
  Builder *this_00;
  Module *module;
  Builder *pBVar2;
  _Rb_tree_header *p_Var3;
  Function *pFVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Capability local_1c;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  module = LLVMBCParser::get_module(this->bitcode_parser);
  bVar1 = module_is_dxilconv(module);
  if (bVar1) {
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    p_Var3 = &(pBVar2->capabilities)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (pBVar2->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var3->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 0x1172])
    {
      if (0x1171 < (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var6 = p_Var5, 0x1172 < (int)p_Var5[1]._M_color)
       ) {
      p_Var6 = &p_Var3->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var3) {
      spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
      local_1c = CapabilitySignedZeroInfNanPreserve;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this_00->capabilities,&local_1c);
      pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
      spv::Builder::addExecutionMode
                (this_00,pFVar4,ExecutionModeSignedZeroInfNanPreserve,0x20,-1,-1);
      p_Var3 = &(this_00->capabilities)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (this_00->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var3->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 10]) {
        if (9 < (int)p_Var6[1]._M_color) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var6 = p_Var5, 10 < (int)p_Var5[1]._M_color))
      {
        p_Var6 = &p_Var3->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 != p_Var3) {
        pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
        spv::Builder::addExecutionMode
                  (this_00,pFVar4,ExecutionModeSignedZeroInfNanPreserve,0x40,-1,-1);
      }
    }
    p_Var3 = &(this_00->capabilities)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this_00->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = p_Var5;
    p_Var7 = &p_Var3->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 0x1171])
    {
      if (0x1170 < (int)p_Var6[1]._M_color) {
        p_Var7 = p_Var6;
      }
    }
    p_Var6 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var3) && (p_Var6 = p_Var7, 0x1171 < (int)p_Var7[1]._M_color)
       ) {
      p_Var6 = &p_Var3->_M_header;
    }
    p_Var7 = &p_Var3->_M_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var3) {
      for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < 0x1170]
          ) {
        if (0x116f < (int)p_Var5[1]._M_color) {
          p_Var7 = p_Var5;
        }
      }
      p_Var6 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var3) &&
         (p_Var6 = p_Var7, 0x1170 < (int)p_Var7[1]._M_color)) {
        p_Var6 = &p_Var3->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var3) {
        spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
        local_1c = CapabilityDenormFlushToZero;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&this_00->capabilities,&local_1c);
        pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
        spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeDenormFlushToZero,0x20,-1,-1);
      }
    }
  }
  p_Var3 = &(this_00->capabilities)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this_00->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var3->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < 9]) {
    if (8 < (int)p_Var6[1]._M_color) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var6 = p_Var5, 9 < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var3->_M_header;
  }
  if (((_Rb_tree_header *)p_Var6 != p_Var3) &&
     ((this->options).supports_float16_denorm_preserve == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    local_1c = CapabilityDenormPreserve;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this_00->capabilities,&local_1c);
    pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeDenormPreserve,0x10,-1,-1);
  }
  p_Var6 = (this_00->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var3->_M_header;
  for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
      p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < 10]) {
    if (9 < (int)*(size_t *)(p_Var6 + 1)) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var6 = p_Var5, 10 < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var3->_M_header;
  }
  if (((_Rb_tree_header *)p_Var6 != p_Var3) &&
     ((this->options).supports_float64_denorm_preserve == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    local_1c = CapabilityDenormPreserve;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this_00->capabilities,&local_1c);
    pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeDenormPreserve,0x40,-1,-1);
  }
  if ((((this->options).supports_quad_control == true) &&
      (this->execution_model == ExecutionModelFragment)) &&
     ((this->execution_mode_meta).needs_quad_derivatives == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_quad_control");
    local_1c = CapabilityQuadControlKHR;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this_00->capabilities,&local_1c);
    pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeRequireFullQuadsKHR,-1,-1,-1);
    pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeQuadDerivativesKHR,-1,-1,-1);
  }
  if (((this->options).supports_maximal_reconvergence == true) &&
     ((((this->options).force_maximal_reconvergence != false ||
       ((this->execution_mode_meta).waveops_include_helper_lanes != false)) ||
      (((this->execution_mode_meta).needs_quad_derivatives != false ||
       ((this->shader_analysis).need_maximal_reconvergence_helper_call == true)))))) {
    spv::Builder::addExtension(this_00,"SPV_KHR_maximal_reconvergence");
    pFVar4 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar4,ExecutionModeMaximallyReconvergesKHR,-1,-1,-1);
  }
  return;
}

Assistant:

void Converter::Impl::emit_execution_modes_post_code_generation()
{
	auto &b = builder();

	if (module_is_dxilconv(bitcode_parser.get_module()))
	{
		// We should use these globally, but don't want to invalidate all Fossilize archives just yet.
		// Shader instrumentation may declare its own preservation modes, so only declare execution modes
		// if we haven't done anything.
		if (!builder().hasCapability(spv::CapabilitySignedZeroInfNanPreserve))
		{
			b.addExtension("SPV_KHR_float_controls");
			b.addCapability(spv::CapabilitySignedZeroInfNanPreserve);
			b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSignedZeroInfNanPreserve, 32);
			if (b.hasCapability(spv::CapabilityFloat64))
				b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSignedZeroInfNanPreserve, 64);
		}

		// DXBC assumes flush-to-zero, but dxilconv doesn't explicitly emit that, since it's not in SM 6.0.
		if (!b.hasCapability(spv::CapabilityDenormFlushToZero) && !b.hasCapability(spv::CapabilityDenormPreserve))
		{
			b.addExtension("SPV_KHR_float_controls");
			b.addCapability(spv::CapabilityDenormFlushToZero);
			b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormFlushToZero, 32);
		}
	}

	// Float16 and Float64 require denorms to be preserved in D3D12.
	if (b.hasCapability(spv::CapabilityFloat16) &&
	    options.supports_float16_denorm_preserve)
	{
		b.addExtension("SPV_KHR_float_controls");
		b.addCapability(spv::CapabilityDenormPreserve);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 16);
	}

	if (b.hasCapability(spv::CapabilityFloat64) &&
	    options.supports_float64_denorm_preserve)
	{
		b.addExtension("SPV_KHR_float_controls");
		b.addCapability(spv::CapabilityDenormPreserve);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 64);
	}

	// Opt into quad derivatives and maximal reconvergence for fragment shaders using
	// QuadAll/QuadAny intrinsics to get meaningful behaviour for quad-uniform control
	// flow, other quad ops are ignored for now.
	if (options.supports_quad_control && execution_model == spv::ExecutionModelFragment &&
	    execution_mode_meta.needs_quad_derivatives)
	{
		b.addExtension("SPV_KHR_quad_control");
		b.addCapability(spv::CapabilityQuadControlKHR);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeRequireFullQuadsKHR);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeQuadDerivativesKHR);
	}

	if (options.supports_maximal_reconvergence &&
	    (options.force_maximal_reconvergence ||
	     execution_mode_meta.waveops_include_helper_lanes ||
	     execution_mode_meta.needs_quad_derivatives ||
	     shader_analysis.need_maximal_reconvergence_helper_call))
	{
		b.addExtension("SPV_KHR_maximal_reconvergence");
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeMaximallyReconvergesKHR);
	}
}